

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfTiledOutputWriteTiles
              (ImfTiledOutputFile *out,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  TiledRgbaOutputFile *in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  exception *e;
  
  anon_unknown.dwarf_70604::outfile((ImfTiledOutputFile *)in_RDI);
  Imf_3_4::TiledRgbaOutputFile::writeTiles(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,in_R9D,unaff_retaddr);
  return 1;
}

Assistant:

int
ImfTiledOutputWriteTiles (
    ImfTiledOutputFile* out,
    int                 dxMin,
    int                 dxMax,
    int                 dyMin,
    int                 dyMax,
    int                 lx,
    int                 ly)
{
    try
    {
        outfile (out)->writeTiles (dxMin, dxMax, dyMin, dyMax, lx, ly);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}